

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraceCalls.cpp
# Opt level: O1

void __thiscall wasm::AddTraceWrappers::~AddTraceWrappers(AddTraceWrappers *this)

{
  pointer pTVar1;
  
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__AddTraceWrappers_01095090;
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree(&(this->tracedFunctions)._M_t);
  pTVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>_>
           ).super_PostWalker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>.
           super_Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>.stack.
           flexible.
           super__Vector_base<wasm::Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>::Task,_std::allocator<wasm::Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_WalkerPass<wasm::PostWalker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>_>
                                          ).
                                          super_PostWalker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>
                                          .
                                          super_Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>::Task,_std::allocator<wasm::Walker<wasm::AddTraceWrappers,_wasm::Visitor<wasm::AddTraceWrappers,_void>_>::Task>_>
                                          ._M_impl + 0x10) - (long)pTVar1);
  }
  Pass::~Pass((Pass *)this);
  operator_delete(this,0x160);
  return;
}

Assistant:

AddTraceWrappers(TracedFunctions tracedFunctions)
    : tracedFunctions(std::move(tracedFunctions)) {}